

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminatablethread.cpp
# Opt level: O2

void __thiscall TerminatableThread::~TerminatableThread(TerminatableThread *this)

{
  this->_vptr_TerminatableThread = (_func_int **)&PTR__TerminatableThread_0024cc70;
  join(this);
  std::thread::~thread(&this->m_thread);
  return;
}

Assistant:

TerminatableThread::~TerminatableThread() { join(); }